

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

int lys_check_id(lys_node *node,lys_node *parent,lys_module *module)

{
  uint uVar1;
  LYS_NODE LVar2;
  LYS_NODE LVar3;
  lys_node **pplVar4;
  lys_node *plVar5;
  lys_node_grp *plVar6;
  lys_node *plVar7;
  char *pcVar8;
  lys_node *plVar9;
  lys_node *plVar10;
  lys_node *plVar11;
  lys_node *plVar12;
  ly_ctx *ctx;
  char *name;
  bool bVar13;
  
  if (node == (lys_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0x24c,
                  "int lys_check_id(struct lys_node *, struct lys_node *, struct lys_module *)");
  }
  if (parent == (lys_node *)0x0) {
    if (module == (lys_module *)0x0) {
      __assert_fail("module",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                    ,0x24f,
                    "int lys_check_id(struct lys_node *, struct lys_node *, struct lys_module *)");
    }
LAB_0015a7fb:
    if ((module->field_0x40 & 1) != 0) {
      module = (lys_module *)module->data;
    }
  }
  else {
    module = parent->module;
    if (module != (lys_module *)0x0) goto LAB_0015a7fb;
    module = (lys_module *)0x0;
  }
  LVar2 = node->nodetype;
  uVar1 = LVar2 - LYS_CONTAINER;
  if (uVar1 < 0x40) {
    if ((0x808bUL >> ((ulong)uVar1 & 0x3f) & 1) != 0) goto LAB_0015a82a;
    if ((ulong)uVar1 == 0x3f) {
      if (parent == (lys_node *)0x0) {
        pplVar4 = &module->data;
      }
      else {
        pplVar4 = lys_child(parent,LYS_CASE);
      }
      plVar5 = *pplVar4;
      while( true ) {
        if (plVar5 == (lys_node *)0x0) {
          return 0;
        }
        if ((((plVar5->nodetype & 0x807d) != LYS_UNKNOWN) && (plVar5->module == node->module)) &&
           (name = node->name, plVar5->name == name)) break;
        plVar5 = plVar5->next;
      }
      ctx = module->ctx;
      pcVar8 = "case";
      goto LAB_0015ab6d;
    }
  }
  if (LVar2 == LYS_ANYDATA) {
LAB_0015a82a:
    if (parent != (lys_node *)0x0) {
      do {
        LVar3 = parent->nodetype;
        if ((LVar3 & (LYS_AUGMENT|LYS_USES|LYS_CASE|LYS_CHOICE)) == LYS_UNKNOWN) {
          if (LVar3 == LYS_EXT) {
            pplVar4 = lys_child(parent,LVar2);
            if (pplVar4 == (lys_node **)0x0) {
              return 0;
            }
          }
          else {
LAB_0015a880:
            pplVar4 = &parent->child;
          }
          goto LAB_0015a885;
        }
        if (LVar3 == LYS_AUGMENT) {
          plVar5 = parent->prev;
          if (plVar5 == (lys_node *)0x0) goto LAB_0015a880;
        }
        else {
          plVar5 = parent->parent;
        }
        parent = plVar5;
      } while (plVar5 != (lys_node *)0x0);
    }
    pplVar4 = &module->data;
    parent = (lys_node *)0x0;
LAB_0015a885:
    plVar5 = *pplVar4;
    do {
      if (plVar5 == (lys_node *)0x0) {
        return 0;
      }
      LVar2 = plVar5->nodetype;
      if ((LVar2 & (LYS_USES|LYS_CASE)) == LYS_UNKNOWN) {
        if ((((LVar2 & (LYS_ANYDATA|LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CHOICE|LYS_CONTAINER)) !=
              LYS_UNKNOWN) && (plVar5->module == node->module)) && (plVar5->name == node->name)) {
          ctx = module->ctx;
          pcVar8 = strnodetype(node->nodetype);
          name = node->name;
          goto LAB_0015ab6d;
        }
        if (LVar2 == LYS_CHOICE) goto LAB_0015a8c2;
        if (plVar5->next == (lys_node *)0x0) {
          while( true ) {
            plVar7 = plVar5->parent;
            if (plVar7 == parent) {
              return 0;
            }
            if (plVar5->nodetype != LYS_EXT) break;
            if (plVar5->padding[1] != '\x01') goto LAB_0015a926;
            plVar5 = (lys_node *)plVar5->dsc;
LAB_0015a901:
            if ((plVar5->nodetype == LYS_AUGMENT) &&
               (plVar5 = plVar5->prev, plVar5 == (lys_node *)0x0)) goto LAB_0015a926;
            if ((plVar5 == parent) || (plVar5->next != (lys_node *)0x0)) goto LAB_0015a928;
          }
          plVar5 = plVar7;
          if (plVar7 != (lys_node *)0x0) goto LAB_0015a901;
LAB_0015a926:
          plVar5 = (lys_node *)0x0;
LAB_0015a928:
          if (plVar5 == parent) {
            return 0;
          }
        }
        pplVar4 = &plVar5->next;
      }
      else {
LAB_0015a8c2:
        pplVar4 = &plVar5->child;
      }
      plVar5 = *pplVar4;
    } while( true );
  }
  if (LVar2 != LYS_GROUPING) {
    return 0;
  }
  if (parent == (lys_node *)0x0) {
    plVar5 = module->data;
    bVar13 = true;
LAB_0015a9ad:
    name = node->name;
    plVar6 = lys_find_grouping_up(name,plVar5);
    if (plVar6 != (lys_node_grp *)0x0) {
      ctx = module->ctx;
      pcVar8 = "grouping";
      goto LAB_0015ab6d;
    }
  }
  else {
    pplVar4 = lys_child(parent,LYS_GROUPING);
    bVar13 = *pplVar4 != (lys_node *)0x0;
    plVar5 = *pplVar4;
    if (!bVar13) {
      plVar5 = parent;
    }
    if (parent->nodetype != LYS_EXT) goto LAB_0015a9ad;
  }
  if (!bVar13) {
    return 0;
  }
  if (plVar5 == (lys_node *)0x0) {
    return 0;
  }
  plVar9 = (lys_node *)0x0;
  plVar7 = plVar5;
  while( true ) {
    plVar11 = plVar5;
    if ((plVar9 != (lys_node *)0x0) && (plVar11 = plVar9, plVar7 == plVar9)) {
      return 0;
    }
    plVar9 = plVar11;
    if ((plVar7->nodetype & (LYS_GROUPING|LYS_OUTPUT|LYS_INPUT|LYS_LIST|LYS_CHOICE|LYS_CONTAINER))
        != LYS_UNKNOWN) break;
LAB_0015aaec:
    plVar7 = plVar7->prev;
    if (plVar7 == (lys_node *)0x0) {
      return 0;
    }
  }
  plVar11 = (lys_node *)0x0;
  do {
    if (plVar11 == (lys_node *)0x0) {
      plVar11 = plVar7;
    }
    LVar2 = plVar11->nodetype;
    plVar10 = plVar11;
    do {
      if (((LVar2 & (LYS_GROUPING|LYS_OUTPUT|LYS_INPUT|LYS_LIST|LYS_CHOICE|LYS_CONTAINER)) ==
           LYS_UNKNOWN) || (plVar11 = plVar10->child, plVar11 == (lys_node *)0x0)) {
        if (plVar10 == plVar7) goto LAB_0015aaec;
        plVar11 = plVar10->next;
        while (plVar11 == (lys_node *)0x0) {
          if (plVar10 == (lys_node *)0x0) {
LAB_0015aa9c:
            plVar11 = (lys_node *)0x0;
          }
          else {
            if (plVar10->nodetype == LYS_EXT) {
              if (plVar10->padding[1] != '\x01') goto LAB_0015aa9c;
              plVar11 = (lys_node *)plVar10->dsc;
            }
            else {
              plVar11 = plVar10->parent;
              if (plVar11 == (lys_node *)0x0) goto LAB_0015aa9c;
            }
            if (plVar11->nodetype == LYS_AUGMENT) {
              plVar11 = plVar11->prev;
            }
          }
          if (plVar11 == plVar7) goto LAB_0015aaec;
          if (plVar10->nodetype == LYS_EXT) {
            if (plVar10->padding[1] != '\x01') goto LAB_0015aad0;
            plVar12 = (lys_node *)plVar10->dsc;
LAB_0015aac1:
            if (plVar12->nodetype == LYS_AUGMENT) {
              plVar12 = plVar12->prev;
            }
          }
          else {
            plVar12 = plVar10->parent;
            if (plVar12 != (lys_node *)0x0) goto LAB_0015aac1;
LAB_0015aad0:
            plVar12 = (lys_node *)0x0;
          }
          plVar11 = plVar10->next;
          plVar10 = plVar12;
        }
      }
      LVar2 = plVar11->nodetype;
      plVar10 = plVar11;
    } while (LVar2 != LYS_GROUPING);
    name = node->name;
  } while (name != plVar11->name);
  ctx = module->ctx;
  pcVar8 = "grouping";
LAB_0015ab6d:
  ly_vlog(ctx,LYE_DUPID,LY_VLOG_LYS,node,pcVar8,name);
  return 1;
}

Assistant:

int
lys_check_id(struct lys_node *node, struct lys_node *parent, struct lys_module *module)
{
    struct lys_node *start, *stop, *iter;
    struct lys_node_grp *grp;
    int down, up;

    assert(node);

    if (!parent) {
        assert(module);
    } else {
        module = parent->module;
    }
    module = lys_main_module(module);

    switch (node->nodetype) {
    case LYS_GROUPING:
        /* 6.2.1, rule 6 */
        if (parent) {
            start = *lys_child(parent, LYS_GROUPING);
            if (!start) {
                down = 0;
                start = parent;
            } else {
                down = 1;
            }
            if (parent->nodetype == LYS_EXT) {
                up = 0;
            } else {
                up = 1;
            }
        } else {
            down = up = 1;
            start = module->data;
        }
        /* go up */
        if (up && lys_find_grouping_up(node->name, start)) {
            LOGVAL(module->ctx, LYE_DUPID, LY_VLOG_LYS, node, "grouping", node->name);
            return EXIT_FAILURE;
        }
        /* go down, because grouping can be defined after e.g. container in which is collision */
        if (down) {
            for (iter = start, stop = NULL; iter; iter = iter->prev) {
                if (!stop) {
                    stop = start;
                } else if (iter == stop) {
                    break;
                }
                if (!(iter->nodetype & (LYS_CONTAINER | LYS_CHOICE | LYS_LIST | LYS_GROUPING | LYS_INPUT | LYS_OUTPUT))) {
                    continue;
                }

                grp = NULL;
                while ((grp = lys_get_next_grouping(grp, iter))) {
                    if (ly_strequal(node->name, grp->name, 1)) {
                        LOGVAL(module->ctx, LYE_DUPID,LY_VLOG_LYS, node, "grouping", node->name);
                        return EXIT_FAILURE;
                    }
                }
            }
        }
        break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
    case LYS_LIST:
    case LYS_CONTAINER:
    case LYS_CHOICE:
    case LYS_ANYDATA:
        /* 6.2.1, rule 7 */
        if (parent) {
            iter = parent;
            while (iter && (iter->nodetype & (LYS_USES | LYS_CASE | LYS_CHOICE | LYS_AUGMENT))) {
                if (iter->nodetype == LYS_AUGMENT) {
                    if (((struct lys_node_augment *)iter)->target) {
                        /* augment is resolved, go up */
                        iter = ((struct lys_node_augment *)iter)->target;
                        continue;
                    }
                    /* augment is not resolved, this is the final parent */
                    break;
                }
                iter = iter->parent;
            }

            if (!iter) {
                stop = NULL;
                iter = module->data;
            } else if (iter->nodetype == LYS_EXT) {
                stop = iter;
                iter = (struct lys_node *)lys_child(iter, node->nodetype);
                if (iter) {
                    iter = *(struct lys_node **)iter;
                }
            } else {
                stop = iter;
                iter = iter->child;
            }
        } else {
            stop = NULL;
            iter = module->data;
        }
        while (iter) {
            if (iter->nodetype & (LYS_USES | LYS_CASE)) {
                iter = iter->child;
                continue;
            }

            if (iter->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_CONTAINER | LYS_CHOICE | LYS_ANYDATA)) {
                if (iter->module == node->module && ly_strequal(iter->name, node->name, 1)) {
                    LOGVAL(module->ctx, LYE_DUPID, LY_VLOG_LYS, node, strnodetype(node->nodetype), node->name);
                    return EXIT_FAILURE;
                }
            }

            /* special case for choice - we must check the choice's name as
             * well as the names of nodes under the choice
             */
            if (iter->nodetype == LYS_CHOICE) {
                iter = iter->child;
                continue;
            }

            /* go to siblings */
            if (!iter->next) {
                /* no sibling, go to parent's sibling */
                do {
                    /* for parent LYS_AUGMENT */
                    if (iter->parent == stop) {
                        iter = stop;
                        break;
                    }
                    iter = lys_parent(iter);
                    if (iter && iter->next) {
                        break;
                    }
                } while (iter != stop);

                if (iter == stop) {
                    break;
                }
            }
            iter = iter->next;
        }
        break;
    case LYS_CASE:
        /* 6.2.1, rule 8 */
        if (parent) {
            start = *lys_child(parent, LYS_CASE);
        } else {
            start = module->data;
        }

        LY_TREE_FOR(start, iter) {
            if (!(iter->nodetype & (LYS_ANYDATA | LYS_CASE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST))) {
                continue;
            }

            if (iter->module == node->module && ly_strequal(iter->name, node->name, 1)) {
                LOGVAL(module->ctx, LYE_DUPID, LY_VLOG_LYS, node, "case", node->name);
                return EXIT_FAILURE;
            }
        }
        break;
    default:
        /* no check needed */
        break;
    }

    return EXIT_SUCCESS;
}